

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler
          (RemotelyControlledSampler *this,SamplingStrategyResponse *response)

{
  ostream *out;
  runtime_error *this_00;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream oss;
  shared_ptr<jaegertracing::samplers::RateLimitingSampler> local_58 [2];
  shared_ptr<jaegertracing::samplers::ProbabilisticSampler> local_38;
  undefined1 local_28 [8];
  shared_ptr<jaegertracing::samplers::Sampler> sampler;
  SamplingStrategyResponse *response_local;
  RemotelyControlledSampler *this_local;
  
  sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)response;
  std::shared_ptr<jaegertracing::samplers::Sampler>::shared_ptr
            ((shared_ptr<jaegertracing::samplers::Sampler> *)local_28);
  if (((ulong)sampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[7]._vptr__Sp_counted_base & 1) == 0) {
    if ((*(byte *)&sampler.
                   super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[7]._vptr__Sp_counted_base >> 1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      out = std::operator<<((ostream *)local_1d0,"Unsupported sampling strategy type ");
      sampling_manager::thrift::operator<<
                (out,(type *)&(sampler.
                               super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_1f0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_shared<jaegertracing::samplers::RateLimitingSampler,short_const&>((short *)local_58);
    std::shared_ptr<jaegertracing::samplers::Sampler>::operator=
              ((shared_ptr<jaegertracing::samplers::Sampler> *)local_28,local_58);
    std::shared_ptr<jaegertracing::samplers::RateLimitingSampler>::~shared_ptr(local_58);
  }
  else {
    std::make_shared<jaegertracing::samplers::ProbabilisticSampler,double_const&>
              ((double *)&local_38);
    std::shared_ptr<jaegertracing::samplers::Sampler>::operator=
              ((shared_ptr<jaegertracing::samplers::Sampler> *)local_28,&local_38);
    std::shared_ptr<jaegertracing::samplers::ProbabilisticSampler>::~shared_ptr(&local_38);
  }
  std::shared_ptr<jaegertracing::samplers::Sampler>::operator=
            (&this->_sampler,(shared_ptr<jaegertracing::samplers::Sampler> *)local_28);
  std::shared_ptr<jaegertracing::samplers::Sampler>::~shared_ptr
            ((shared_ptr<jaegertracing::samplers::Sampler> *)local_28);
  return;
}

Assistant:

void RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler(
    const SamplingStrategyResponse& response)
{
    std::shared_ptr<Sampler> sampler;
    if (response.__isset.probabilisticSampling) {
        sampler = std::make_shared<ProbabilisticSampler>(
            response.probabilisticSampling.samplingRate);
    }
    else if (response.__isset.rateLimitingSampling) {
        sampler = std::make_shared<RateLimitingSampler>(
            response.rateLimitingSampling.maxTracesPerSecond);
    }
    else {
        std::ostringstream oss;
        oss << "Unsupported sampling strategy type " << response.strategyType;
        throw std::runtime_error(oss.str());
    }
    _sampler = sampler;
}